

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int subjournalPageIfRequired(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPager;
  PagerSavepoint *pPVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  sqlite3_file *pJfd;
  long lVar6;
  undefined4 *puVar7;
  int iVar8;
  long lVar9;
  Pgno i;
  
  pPager = pPg->pPager;
  i = pPg->pgno;
  uVar1 = pPager->nSavepoint;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar8 = 1;
  lVar9 = -0x58;
  lVar6 = 0x18;
  while( true ) {
    if (uVar5 * 0x38 + lVar9 == -0x58) {
      return 0;
    }
    pPVar2 = pPager->aSavepoint;
    if ((i <= *(uint *)((long)pPVar2->aWalData + lVar6 + -0x24)) &&
       (iVar4 = sqlite3BitvecTestNotNull(*(Bitvec **)((long)pPVar2->aWalData + lVar6 + -0x2c),i),
       iVar4 == 0)) break;
    iVar8 = iVar8 + 1;
    lVar9 = lVar9 + -0x38;
    lVar6 = lVar6 + 0x38;
  }
  puVar7 = (undefined4 *)((long)pPVar2 - lVar9);
  for (; iVar8 < (int)uVar1; iVar8 = iVar8 + 1) {
    *puVar7 = 0;
    puVar7 = puVar7 + 0xe;
  }
  if (pPager->journalMode != '\x02') {
    pJfd = pPager->sjfd;
    if (pJfd->pMethods == (sqlite3_io_methods *)0x0) {
      if ((pPager->journalMode == '\x04') ||
         (iVar8 = sqlite3Config.nStmtSpill, pPager->subjInMemory != '\0')) {
        iVar8 = -1;
      }
      iVar8 = sqlite3JournalOpen(pPager->pVfs,(char *)0x0,pJfd,0x201e,iVar8);
      if (iVar8 != 0) {
        return iVar8;
      }
      pJfd = pPager->sjfd;
      i = pPg->pgno;
    }
    pvVar3 = pPg->pData;
    lVar9 = (pPager->pageSize + 4) * (ulong)pPager->nSubRec;
    iVar8 = write32bits(pJfd,lVar9,i);
    if (iVar8 != 0) {
      return iVar8;
    }
    iVar8 = (*pPager->sjfd->pMethods->xWrite)(pPager->sjfd,pvVar3,(int)pPager->pageSize,lVar9 + 4);
    if (iVar8 != 0) {
      return iVar8;
    }
    i = pPg->pgno;
  }
  pPager->nSubRec = pPager->nSubRec + 1;
  iVar8 = addToSavepointBitvecs(pPager,i);
  return iVar8;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  PagerSavepoint *p;
  Pgno pgno = pPg->pgno;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTestNotNull(p->pInSavepoint, pgno) ){
      for(i=i+1; i<pPager->nSavepoint; i++){
        pPager->aSavepoint[i].bTruncateOnRelease = 0;
      }
      return 1;
    }
  }
  return 0;
}